

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::CreateConstantTable(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  WriteBarrierPtr<void> *__s;
  RootObjectBase *var;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->m_constTable).ptr != (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1103,"(this->GetConstTable() == nullptr)",
                                "this->GetConstTable() == nullptr");
    if (!bVar2) goto LAB_00773da7;
    *puVar5 = 0;
  }
  uVar3 = GetCountField(this,ConstantCount);
  if (uVar3 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1104,"(GetConstantCount() > FirstRegSlot)",
                                "GetConstantCount() > FirstRegSlot");
    if (!bVar2) goto LAB_00773da7;
    *puVar5 = 0;
  }
  pRVar6 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  uVar3 = GetCountField(this,ConstantCount);
  data.plusSize = (size_t)uVar3;
  local_50 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x1106;
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_50);
  uVar3 = GetCountField(this,ConstantCount);
  if (uVar3 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
    __s = (WriteBarrierPtr<void> *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00773da7;
      *puVar5 = 0;
    }
    __s = (WriteBarrierPtr<void> *)
          Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                    (pRVar6,(ulong)uVar3 << 3);
    if (__s == (WriteBarrierPtr<void> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00773da7;
      *puVar5 = 0;
    }
    memset(__s,0,(ulong)uVar3 << 3);
  }
  Memory::Recycler::WBSetBit((char *)&this->m_constTable);
  (this->m_constTable).ptr = __s;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_constTable);
  var = LoadRootObject(this);
  if (var == (RootObjectBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1110,"(false)","false");
    if (!bVar2) {
LAB_00773da7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    var = (RootObjectBase *)
          (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  RecordConstant(this,1,var);
  return;
}

Assistant:

void FunctionBody::CreateConstantTable()
    {
        Assert(this->GetConstTable() == nullptr);
        Assert(GetConstantCount() > FirstRegSlot);

        this->SetConstTable(RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(), Field(Var), GetConstantCount()));

        // Initialize with the root object, which will always be recorded here.
        Js::RootObjectBase * rootObject = this->LoadRootObject();
        if (rootObject)
        {
            this->RecordConstant(RootObjectRegSlot, rootObject);
        }
        else
        {
            Assert(false);
            this->RecordConstant(RootObjectRegSlot, this->m_scriptContext->GetLibrary()->GetUndefined());
        }

    }